

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

TimeZoneRule * __thiscall
icu_63::RuleBasedTimeZone::findRuleInFinal
          (RuleBasedTimeZone *this,UDate date,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt)

{
  UDate UVar1;
  AnnualTimeZoneRule *pAVar2;
  char cVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  RuleBasedTimeZone *local_b0;
  UBool avail1;
  UBool avail0;
  double dStack_58;
  int32_t localDelta;
  UDate base;
  UDate start1;
  UDate start0;
  AnnualTimeZoneRule *fr1;
  AnnualTimeZoneRule *fr0;
  int32_t local_28;
  int32_t DuplicatedTimeOpt_local;
  int32_t NonExistingTimeOpt_local;
  UBool local_local;
  UDate date_local;
  RuleBasedTimeZone *this_local;
  
  if (this->fFinalRules == (UVector *)0x0) {
    this_local = (RuleBasedTimeZone *)0x0;
  }
  else {
    fr0._4_4_ = DuplicatedTimeOpt;
    local_28 = NonExistingTimeOpt;
    DuplicatedTimeOpt_local._3_1_ = local;
    _NonExistingTimeOpt_local = date;
    date_local = (UDate)this;
    fr1 = (AnnualTimeZoneRule *)UVector::elementAt(this->fFinalRules,0);
    start0 = (UDate)UVector::elementAt(this->fFinalRules,1);
    dStack_58 = _NonExistingTimeOpt_local;
    if ((fr1 == (AnnualTimeZoneRule *)0x0) || ((TimeZoneRule *)start0 == (TimeZoneRule *)0x0)) {
      this_local = (RuleBasedTimeZone *)0x0;
    }
    else {
      if (DuplicatedTimeOpt_local._3_1_ != '\0') {
        iVar4 = TimeZoneRule::getRawOffset((TimeZoneRule *)start0);
        iVar5 = TimeZoneRule::getDSTSavings((TimeZoneRule *)start0);
        iVar6 = TimeZoneRule::getRawOffset(&fr1->super_TimeZoneRule);
        iVar7 = TimeZoneRule::getDSTSavings(&fr1->super_TimeZoneRule);
        iVar4 = getLocalDelta(this,iVar4,iVar5,iVar6,iVar7,local_28,fr0._4_4_);
        dStack_58 = dStack_58 - (double)iVar4;
      }
      pAVar2 = fr1;
      uVar8 = TimeZoneRule::getRawOffset((TimeZoneRule *)start0);
      uVar9 = TimeZoneRule::getDSTSavings((TimeZoneRule *)start0);
      iVar10 = (*(pAVar2->super_TimeZoneRule).super_UObject._vptr_UObject[10])
                         (dStack_58,pAVar2,(ulong)uVar8,(ulong)uVar9,1,&start1);
      dStack_58 = _NonExistingTimeOpt_local;
      if (DuplicatedTimeOpt_local._3_1_ != '\0') {
        iVar4 = TimeZoneRule::getRawOffset(&fr1->super_TimeZoneRule);
        iVar5 = TimeZoneRule::getDSTSavings(&fr1->super_TimeZoneRule);
        iVar6 = TimeZoneRule::getRawOffset((TimeZoneRule *)start0);
        iVar7 = TimeZoneRule::getDSTSavings((TimeZoneRule *)start0);
        iVar4 = getLocalDelta(this,iVar4,iVar5,iVar6,iVar7,local_28,fr0._4_4_);
        dStack_58 = dStack_58 - (double)iVar4;
      }
      UVar1 = start0;
      iVar4 = TimeZoneRule::getRawOffset(&fr1->super_TimeZoneRule);
      iVar5 = TimeZoneRule::getDSTSavings(&fr1->super_TimeZoneRule);
      cVar3 = (**(code **)(*(long *)UVar1 + 0x50))(dStack_58,UVar1,iVar4,iVar5,1,&base);
      if (((char)iVar10 == '\0') || (cVar3 == '\0')) {
        if ((char)iVar10 == '\0') {
          if (cVar3 == '\0') {
            this_local = (RuleBasedTimeZone *)0x0;
          }
          else {
            this_local = (RuleBasedTimeZone *)start0;
          }
        }
        else {
          this_local = (RuleBasedTimeZone *)fr1;
        }
      }
      else {
        if (start1 <= base) {
          local_b0 = (RuleBasedTimeZone *)start0;
        }
        else {
          local_b0 = (RuleBasedTimeZone *)fr1;
        }
        this_local = local_b0;
      }
    }
  }
  return (TimeZoneRule *)this_local;
}

Assistant:

TimeZoneRule*
RuleBasedTimeZone::findRuleInFinal(UDate date, UBool local,
                                   int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt) const {
    if (fFinalRules == NULL) {
        return NULL;
    }

    AnnualTimeZoneRule* fr0 = (AnnualTimeZoneRule*)fFinalRules->elementAt(0);
    AnnualTimeZoneRule* fr1 = (AnnualTimeZoneRule*)fFinalRules->elementAt(1);
    if (fr0 == NULL || fr1 == NULL) {
        return NULL;
    }

    UDate start0, start1;
    UDate base;
    int32_t localDelta;

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr1->getRawOffset(), fr1->getDSTSavings(),
                                   fr0->getRawOffset(), fr0->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail0 = fr0->getPreviousStart(base, fr1->getRawOffset(), fr1->getDSTSavings(), TRUE, start0);

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr0->getRawOffset(), fr0->getDSTSavings(),
                                   fr1->getRawOffset(), fr1->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail1 = fr1->getPreviousStart(base, fr0->getRawOffset(), fr0->getDSTSavings(), TRUE, start1);

    if (!avail0 || !avail1) {
        if (avail0) {
            return fr0;
        } else if (avail1) {
            return fr1;
        }
        // Both rules take effect after the given time
        return NULL;
    }

    return (start0 > start1) ? fr0 : fr1;
}